

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_count.hpp
# Opt level: O0

void __thiscall optimization::ref_count::Ref_Count::optimize_func(Ref_Count *this,MirFunction *func)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  pointer ppVar4;
  pointer pIVar5;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  BasicBlk *in_stack_00000068;
  Ref_Count *in_stack_00000070;
  OpInst *assignInst;
  Inst *i;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2;
  BasicBlk *startblk;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *in_stack_ffffffffffffff38;
  shared_ptr<optimization::ref_count::Env> *__r;
  shared_ptr<optimization::ref_count::Env> *in_stack_ffffffffffffff40;
  undefined8 local_b8;
  MirFunction *in_stack_ffffffffffffff68;
  shared_ptr<optimization::ref_count::Env> local_60;
  undefined8 local_50;
  type local_48;
  reference local_40;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_38;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_30;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_28;
  _Base_ptr local_20;
  BasicBlk *local_18;
  
  peVar3 = std::
           __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a3595);
  if ((peVar3->is_extern & 1U) == 0) {
    local_20 = (_Base_ptr)
               std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::begin(in_stack_ffffffffffffff38);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1a35c6);
    local_18 = &ppVar4->second;
    local_28 = &(ppVar4->second).inst;
    local_30._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_ffffffffffffff38);
    local_38 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      local_40 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_30);
      pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1a3650);
      iVar2 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 0) {
        local_48 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                   operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             in_stack_ffffffffffffff40);
        if (local_48 == (type)0x0) {
          local_b8 = 0;
        }
        else {
          local_b8 = __dynamic_cast(local_48,&mir::inst::Inst::typeinfo,&mir::inst::OpInst::typeinfo
                                    ,0);
        }
        local_50 = local_b8;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_30);
    }
    __r = &local_60;
    std::make_shared<optimization::ref_count::Env,mir::inst::MirFunction&>
              (in_stack_ffffffffffffff68);
    std::shared_ptr<optimization::ref_count::Env>::operator=(in_stack_ffffffffffffff40,__r);
    std::shared_ptr<optimization::ref_count::Env>::~shared_ptr
              ((shared_ptr<optimization::ref_count::Env> *)0x1a36ff);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1a370e);
    DFS(in_stack_00000070,in_stack_00000068,
        (set<int,_std::less<int>,_std::allocator<int>_> *)
        visited._M_t._M_impl.super__Rb_tree_header._M_node_count,
        visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,
        (int)visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1a373c);
  }
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    if (func.type->is_extern) {
      return;
    }
    auto& startblk = func.basic_blks.begin()->second;
    for (auto& inst : startblk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Assign) {
        auto& i = *inst;
        auto assignInst = dynamic_cast<mir::inst::OpInst*>(&i);
      }
    }
    env = std::make_shared<Env>(func);
    std::set<mir::types::LabelId> visited;
    DFS(startblk, visited, 1);
  }